

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaBlockMetadata_TLSF::CheckCorruption(VmaBlockMetadata_TLSF *this,void *pBlockData)

{
  bool bVar1;
  void *in_RSI;
  long in_RDI;
  Block *block;
  Block *local_20;
  
  local_20 = *(Block **)(*(long *)(in_RDI + 0x170) + 0x10);
  while( true ) {
    if (local_20 == (Block *)0x0) {
      return VK_SUCCESS;
    }
    bVar1 = Block::IsFree(local_20);
    if ((!bVar1) &&
       (bVar1 = VmaValidateMagicValue(in_RSI,local_20->offset + local_20->size), !bVar1)) break;
    local_20 = local_20->prevPhysical;
  }
  return VK_ERROR_UNKNOWN;
}

Assistant:

VkResult VmaBlockMetadata_TLSF::CheckCorruption(const void* pBlockData)
{
    for (Block* block = m_NullBlock->prevPhysical; block != VMA_NULL; block = block->prevPhysical)
    {
        if (!block->IsFree())
        {
            if (!VmaValidateMagicValue(pBlockData, block->offset + block->size))
            {
                VMA_ASSERT(0 && "MEMORY CORRUPTION DETECTED AFTER VALIDATED ALLOCATION!");
                return VK_ERROR_UNKNOWN_COPY;
            }
        }
    }

    return VK_SUCCESS;
}